

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::TextureVkImpl::CreateViewInternal
          (TextureVkImpl *this,TextureViewDesc *ViewDesc,ITextureView **ppView,bool bIsDefaultView)

{
  Char *pCVar1;
  FixedBlockMemoryAllocator *Allocator;
  TextureViewDesc *pTVar2;
  TextureVkImpl *local_190;
  char *ViewTypeName;
  runtime_error *anon_var_0;
  string msg_3;
  RenderDeviceVkImpl *local_118;
  MakeNewRCObj<Diligent::TextureViewVkImpl,_Diligent::FixedBlockMemoryAllocator> local_110;
  TextureViewVkImpl *local_e8;
  TextureViewVkImpl *pViewVk;
  ImageViewWrapper ImgView;
  TextureViewDesc UpdatedViewDesc;
  string msg_2;
  FixedBlockMemoryAllocator *TexViewAllocator;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  bool bIsDefaultView_local;
  ITextureView **ppView_local;
  TextureViewDesc *ViewDesc_local;
  TextureVkImpl *this_local;
  
  msg.field_2._M_local_buf[0xf] = bIsDefaultView;
  if (ppView == (ITextureView **)0x0) {
    FormatString<char[29]>((string *)local_48,(char (*) [29])"View pointer address is null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x2b9);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    if (*ppView != (ITextureView *)0x0) {
      FormatString<char[64]>
                ((string *)&TexViewAllocator,
                 (char (*) [64])"Overwriting reference to existing object may cause memory leaks");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,699);
      std::__cxx11::string::~string((string *)&TexViewAllocator);
    }
    *ppView = (ITextureView *)0x0;
    Allocator = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetTexViewObjAllocator
                          ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
                           (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           .m_pDevice);
    if (Allocator !=
        (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_dbgTexViewObjAllocator) {
      FormatString<char[87]>
                ((string *)&UpdatedViewDesc.Swizzle.B,
                 (char (*) [87])
                 "Texture view allocator does not match allocator provided during texture initialization"
                );
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x2c2);
      std::__cxx11::string::~string((string *)&UpdatedViewDesc.Swizzle.B);
    }
    UpdatedViewDesc._24_8_ = *(undefined8 *)&(ViewDesc->Swizzle).B;
    ImgView.m_VkObject = (VkImageView_T *)(ViewDesc->super_DeviceObjectAttribs).Name;
    UpdatedViewDesc.super_DeviceObjectAttribs.Name = *(Char **)&ViewDesc->ViewType;
    UpdatedViewDesc._8_8_ = *(undefined8 *)&ViewDesc->NumMipLevels;
    UpdatedViewDesc._16_8_ = *(undefined8 *)&ViewDesc->field_6;
    ValidatedAndCorrectTextureViewDesc
              (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc,(TextureViewDesc *)&ImgView.m_VkObject);
    CreateImageView((ImageViewWrapper *)&pViewVk,this,(TextureViewDesc *)&ImgView.m_VkObject);
    local_190 = this;
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_190 = (TextureVkImpl *)0x0;
    }
    MakeNewRCObj<Diligent::TextureViewVkImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
              (&local_110,Allocator,"TextureViewVkImpl instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x2c8,(IObject *)local_190);
    local_118 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                             *)this);
    msg_3.field_2._8_8_ = this;
    local_e8 = MakeNewRCObj<Diligent::TextureViewVkImpl,Diligent::FixedBlockMemoryAllocator>::
               operator()((MakeNewRCObj<Diligent::TextureViewVkImpl,Diligent::FixedBlockMemoryAllocator>
                           *)&local_110,&local_118,(TextureViewDesc *)&ImgView.m_VkObject,
                          (TextureVkImpl **)((long)&msg_3.field_2 + 8),
                          (VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5>
                           *)&pViewVk,(bool *)(msg.field_2._M_local_buf + 0xf));
    pTVar2 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        *)local_e8);
    if (pTVar2->ViewType != ViewDesc->ViewType) {
      FormatString<char[20]>((string *)&anon_var_0,(char (*) [20])"Incorrect view type");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x2c9);
      std::__cxx11::string::~string((string *)&anon_var_0);
    }
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      TextureViewVkImpl::QueryInterface(local_e8,(INTERFACE_ID *)IID_TextureView,(IObject **)ppView)
      ;
    }
    else {
      *ppView = (ITextureView *)local_e8;
    }
    VulkanUtilities::VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5>::
    ~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5> *)
               &pViewVk);
  }
  return;
}

Assistant:

void TextureVkImpl::CreateViewInternal(const TextureViewDesc& ViewDesc, ITextureView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "View pointer address is null");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        FixedBlockMemoryAllocator& TexViewAllocator = m_pDevice->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        TextureViewDesc UpdatedViewDesc = ViewDesc;
        ValidatedAndCorrectTextureViewDesc(m_Desc, UpdatedViewDesc);

        VulkanUtilities::ImageViewWrapper ImgView = CreateImageView(UpdatedViewDesc);
        TextureViewVkImpl*                pViewVk = NEW_RC_OBJ(TexViewAllocator, "TextureViewVkImpl instance", TextureViewVkImpl, bIsDefaultView ? this : nullptr)(GetDevice(), UpdatedViewDesc, this, std::move(ImgView), bIsDefaultView);
        VERIFY(pViewVk->GetDesc().ViewType == ViewDesc.ViewType, "Incorrect view type");

        if (bIsDefaultView)
            *ppView = pViewVk;
        else
            pViewVk->QueryInterface(IID_TextureView, reinterpret_cast<IObject**>(ppView));
    }
    catch (const std::runtime_error&)
    {
        const char* ViewTypeName = GetTexViewTypeLiteralName(ViewDesc.ViewType);
        LOG_ERROR("Failed to create view \"", ViewDesc.Name ? ViewDesc.Name : "", "\" (", ViewTypeName, ") for texture \"", m_Desc.Name ? m_Desc.Name : "", "\"");
    }
}